

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O2

string * random_string_abi_cxx11_(void)

{
  long lVar1;
  undefined **ppuVar2;
  string *in_RDI;
  iterator ppcVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  initializer_list<const_char_*> __l;
  undefined1 local_c8 [8];
  uniform_int_distribution<unsigned_long> dist6;
  undefined1 local_48 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> allowed;
  
  bVar6 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,"",(allocator<char> *)local_c8);
  ppuVar2 = &PTR_anon_var_dwarf_3ec6_00104d28;
  ppcVar3 = (iterator)local_c8;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppcVar3 = *ppuVar2;
    ppuVar2 = ppuVar2 + (ulong)bVar6 * -2 + 1;
    ppcVar3 = ppcVar3 + (ulong)bVar6 * -2 + 1;
  }
  __l._M_len = 0x10;
  __l._M_array = (iterator)local_c8;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,__l,
             (allocator_type *)
             ((long)&allowed.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = 0x14;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    dist6._M_param._M_a =
         ((long)allowed.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start - (long)local_48 >> 3) - 1;
    local_c8 = (undefined1  [8])0x0;
    std::uniform_int_distribution<unsigned_long>::operator()
              ((uniform_int_distribution<unsigned_long> *)local_c8,&rng);
    std::__cxx11::string::append((char *)in_RDI);
  }
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            ((_Vector_base<const_char_*,_std::allocator<const_char_*>_> *)local_48);
  return in_RDI;
}

Assistant:

std::string random_string() {

    std::string buf = "";
    std::vector allowed = {"a", "b", "c", "d", "e", "f", "1", "2", "3", "4", "5", "6", "7", "8", "9", "0"};

    for (int i = 0; i < 20; ++i) {
        std::uniform_int_distribution<std::mt19937::result_type> dist6(0, allowed.size() - 1);
        auto rnd = dist6(rng);

        buf.append(allowed[rnd]);
    }

    return buf;
}